

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O1

int __thiscall TinyProcessLib::Process::open(Process *this,char *__file,int __oflag,...)

{
  int iVar1;
  __pid_t _Var2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  int stdin_p [2];
  int stdout_p [2];
  int stderr_p [2];
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  if (this->open_stdin == true) {
    piVar3 = (int *)operator_new(4);
    piVar4 = (this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    (this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = piVar3;
    if (piVar4 != (int *)0x0) {
      operator_delete(piVar4);
    }
  }
  if ((this->read_stdout).super__Function_base._M_manager != (_Manager_type)0x0) {
    piVar3 = (int *)operator_new(4);
    piVar4 = (this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    (this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = piVar3;
    if (piVar4 != (int *)0x0) {
      operator_delete(piVar4);
    }
  }
  if ((this->read_stderr).super__Function_base._M_manager != (_Manager_type)0x0) {
    piVar3 = (int *)operator_new(4);
    piVar4 = (this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    (this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = piVar3;
    if (piVar4 != (int *)0x0) {
      operator_delete(piVar4);
    }
  }
  if (((this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl != (int *)0x0) && (iVar1 = pipe(&local_30), iVar1 != 0)) {
    return -1;
  }
  if (((this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl == (int *)0x0) || (iVar1 = pipe(&local_28), iVar1 == 0)) {
    if (((this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
         super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl == (int *)0x0) ||
       (iVar1 = pipe(&local_20), iVar1 == 0)) {
      _Var2 = fork();
      if (-1 < _Var2) {
        piVar4 = (this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        if (_Var2 != 0) {
          if (piVar4 != (int *)0x0) {
            close(local_30);
          }
          if ((this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
            close(local_24);
          }
          if ((this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
            close(local_1c);
          }
          piVar4 = (this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
          if (piVar4 != (int *)0x0) {
            *piVar4 = local_2c;
          }
          piVar4 = (this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t
                   .super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
          if (piVar4 != (int *)0x0) {
            *piVar4 = local_28;
          }
          piVar4 = (this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t
                   .super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
          if (piVar4 != (int *)0x0) {
            *piVar4 = local_20;
          }
          this->closed = false;
          (this->data).id = _Var2;
          return _Var2;
        }
        if (piVar4 != (int *)0x0) {
          dup2(local_30,0);
        }
        if ((this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
          dup2(local_24,1);
        }
        if ((this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
          dup2(local_1c,2);
        }
        if ((this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
          close(local_30);
          close(local_2c);
        }
        if ((this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
          close(local_28);
          close(local_24);
        }
        if ((this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
          close(local_20);
          close(local_1c);
        }
        if ((this->config).inherit_file_descriptors == false) {
          lVar5 = sysconf(4);
          if (3 < (int)lVar5) {
            iVar1 = 3;
            do {
              close(iVar1);
              iVar1 = iVar1 + 1;
            } while ((int)lVar5 != iVar1);
          }
        }
        setpgid(0,0);
        if (*(long *)(__file + 0x10) != 0) {
          (**(code **)(__file + 0x18))(__file);
        }
        _exit(1);
      }
      if ((this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
        close(local_30);
        close(local_2c);
      }
      if ((this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
        close(local_28);
        close(local_24);
      }
      if ((this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl == (int *)0x0) {
        return _Var2;
      }
      close(local_20);
      close(local_1c);
      return _Var2;
    }
    if ((this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>
        ._M_head_impl != (int *)0x0) {
      close(local_30);
      close(local_2c);
    }
    if ((this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>
        ._M_head_impl == (int *)0x0) {
      return -1;
    }
    close(local_28);
    piVar4 = &local_24;
  }
  else {
    if ((this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>
        ._M_head_impl == (int *)0x0) {
      return -1;
    }
    close(local_30);
    piVar4 = &local_2c;
  }
  close(*piVar4);
  return -1;
}

Assistant:

Process::id_type Process::open(const std::function<void()> &function) noexcept {
  if(open_stdin)
    stdin_fd = std::unique_ptr<fd_type>(new fd_type);
  if(read_stdout)
    stdout_fd = std::unique_ptr<fd_type>(new fd_type);
  if(read_stderr)
    stderr_fd = std::unique_ptr<fd_type>(new fd_type);

  int stdin_p[2], stdout_p[2], stderr_p[2];

  if(stdin_fd && pipe(stdin_p) != 0)
    return -1;
  if(stdout_fd && pipe(stdout_p) != 0) {
    if(stdin_fd) {
      close(stdin_p[0]);
      close(stdin_p[1]);
    }
    return -1;
  }
  if(stderr_fd && pipe(stderr_p) != 0) {
    if(stdin_fd) {
      close(stdin_p[0]);
      close(stdin_p[1]);
    }
    if(stdout_fd) {
      close(stdout_p[0]);
      close(stdout_p[1]);
    }
    return -1;
  }

  id_type pid = fork();

  if(pid < 0) {
    if(stdin_fd) {
      close(stdin_p[0]);
      close(stdin_p[1]);
    }
    if(stdout_fd) {
      close(stdout_p[0]);
      close(stdout_p[1]);
    }
    if(stderr_fd) {
      close(stderr_p[0]);
      close(stderr_p[1]);
    }
    return pid;
  }
  else if(pid == 0) {
    if(stdin_fd)
      dup2(stdin_p[0], 0);
    if(stdout_fd)
      dup2(stdout_p[1], 1);
    if(stderr_fd)
      dup2(stderr_p[1], 2);
    if(stdin_fd) {
      close(stdin_p[0]);
      close(stdin_p[1]);
    }
    if(stdout_fd) {
      close(stdout_p[0]);
      close(stdout_p[1]);
    }
    if(stderr_fd) {
      close(stderr_p[0]);
      close(stderr_p[1]);
    }

    if(!config.inherit_file_descriptors) {
      int fd_max = static_cast<int>(sysconf(_SC_OPEN_MAX)); // truncation is safe
      // Based on http://stackoverflow.com/a/899533/3808293
      // TODO: find a way to optimize, as this is slow on systems with high fd_max
      for(int fd = 3; fd < fd_max; fd++)
        close(fd);
    }

    setpgid(0, 0);
    //TODO: See here on how to emulate tty for colors: http://stackoverflow.com/questions/1401002/trick-an-application-into-thinking-its-stdin-is-interactive-not-a-pipe
    //TODO: One solution is: echo "command;exit"|script -q /dev/null

    if(function)
      function();

    _exit(EXIT_FAILURE);
  }

  if(stdin_fd)
    close(stdin_p[0]);
  if(stdout_fd)
    close(stdout_p[1]);
  if(stderr_fd)
    close(stderr_p[1]);

  if(stdin_fd)
    *stdin_fd = stdin_p[1];
  if(stdout_fd)
    *stdout_fd = stdout_p[0];
  if(stderr_fd)
    *stderr_fd = stderr_p[0];

  closed = false;
  data.id = pid;
  return pid;
}